

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

UCalendarDateFields booster::locale::impl_icu::to_icu(period_mark f)

{
  undefined8 uVar1;
  string *s;
  int in_EDI;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [36];
  UCalendarDateFields local_4;
  
  s = (string *)(ulong)(in_EDI - 1);
  switch(s) {
  case (string *)0x0:
    local_4 = UCAL_ERA;
    break;
  case (string *)0x1:
    local_4 = UCAL_YEAR;
    break;
  case (string *)0x2:
    local_4 = UCAL_EXTENDED_YEAR;
    break;
  case (string *)0x3:
    local_4 = UCAL_MONTH;
    break;
  case (string *)0x4:
    local_4 = UCAL_DATE;
    break;
  case (string *)0x5:
    local_4 = UCAL_DAY_OF_YEAR;
    break;
  case (string *)0x6:
    local_4 = UCAL_DAY_OF_WEEK;
    break;
  case (string *)0x7:
    local_4 = UCAL_DAY_OF_WEEK_IN_MONTH;
    break;
  case (string *)0x8:
    local_4 = UCAL_DOW_LOCAL;
    break;
  case (string *)0x9:
    local_4 = UCAL_HOUR_OF_DAY;
    break;
  case (string *)0xa:
    local_4 = UCAL_HOUR;
    break;
  case (string *)0xb:
    local_4 = UCAL_AM_PM;
    break;
  case (string *)0xc:
    local_4 = UCAL_MINUTE;
    break;
  case (string *)0xd:
    local_4 = UCAL_SECOND;
    break;
  case (string *)0xe:
    local_4 = UCAL_WEEK_OF_YEAR;
    break;
  case (string *)0xf:
    local_4 = UCAL_WEEK_OF_MONTH;
    break;
  default:
    uVar2 = CONCAT13(1,in_stack_ffffffffffffffc0);
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Invalid date_time period type",&local_29);
    invalid_argument::invalid_argument
              ((invalid_argument *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),s);
    __cxa_throw(uVar1,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
  }
  return local_4;
}

Assistant:

static UCalendarDateFields to_icu(period::marks::period_mark f)
    {
        using namespace period::marks;

        switch(f) {
        case era: return UCAL_ERA;
        case year: return UCAL_YEAR;
        case extended_year: return UCAL_EXTENDED_YEAR;
        case month: return UCAL_MONTH;
        case day: return UCAL_DATE;
        case day_of_year: return UCAL_DAY_OF_YEAR;
        case day_of_week: return UCAL_DAY_OF_WEEK;
        case day_of_week_in_month:  return UCAL_DAY_OF_WEEK_IN_MONTH;
        case day_of_week_local: return UCAL_DOW_LOCAL;
        case hour: return UCAL_HOUR_OF_DAY;
        case hour_12: return UCAL_HOUR;
        case am_pm: return UCAL_AM_PM;
        case minute: return UCAL_MINUTE;
        case second: return UCAL_SECOND;
        case week_of_year: return UCAL_WEEK_OF_YEAR;
        case week_of_month: return UCAL_WEEK_OF_MONTH;
        default:
            throw booster::invalid_argument("Invalid date_time period type");
        }
    }